

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectMeshNormals(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  pointer pFVar2;
  vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *pvVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong __new_size;
  uint a;
  ulong uVar7;
  bool bVar8;
  aiVector3D aVar9;
  allocator<char> local_69;
  ulong local_68;
  vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *local_60;
  string local_58;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar4 = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&pMesh->mNormals,(ulong)uVar4);
  for (lVar6 = 0; (ulong)uVar4 * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
    aVar9 = ReadVector3(this);
    paVar1 = (pMesh->mNormals).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(long *)((long)&paVar1->x + lVar6) = aVar9._0_8_;
    *(float *)((long)&paVar1->z + lVar6) = aVar9.z;
  }
  uVar4 = ReadInt(this);
  __new_size = (ulong)uVar4;
  if (((long)(pMesh->mPosFaces).
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(pMesh->mPosFaces).
            super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x18 == __new_size) {
    if (__new_size != 0) {
      local_60 = &pMesh->mNormFaces;
      std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize
                (local_60,__new_size);
      pvVar3 = local_60;
      local_68 = __new_size;
      for (uVar7 = 0; uVar7 != local_68; uVar7 = uVar7 + 1) {
        uVar4 = ReadInt(this);
        local_58.field_2._M_allocated_capacity = 0;
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  (&(pvVar3->
                    super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar7].mIndices,&local_58);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
        pFVar2 = (pvVar3->
                 super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
          uVar5 = ReadInt(this);
          local_58._M_dataplus._M_p._0_4_ = uVar5;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&pFVar2[uVar7].mIndices,(uint *)&local_58);
        }
        TestForSeparator(this);
      }
    }
    CheckForClosingBrace(this);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Normal face count does not match vertex face count.",&local_69);
  ThrowException(this,&local_58);
}

Assistant:

void XFileParser::ParseDataObjectMeshNormals( Mesh* pMesh)
{
    readHeadOfDataObject();

    // read count
    unsigned int numNormals = ReadInt();
    pMesh->mNormals.resize( numNormals);

    // read normal vectors
    for( unsigned int a = 0; a < numNormals; ++a) {
        pMesh->mNormals[a] = ReadVector3();
    }

    // read normal indices
    unsigned int numFaces = ReadInt();
    if( numFaces != pMesh->mPosFaces.size()) {
        ThrowException( "Normal face count does not match vertex face count.");
    }

    // do not crah when no face definitions are there
    if (numFaces > 0) {
        // normal face creation
        pMesh->mNormFaces.resize( numFaces );
        for( unsigned int a = 0; a < numFaces; ++a ) {
            unsigned int numIndices = ReadInt();
            pMesh->mNormFaces[a] = Face();
            Face& face = pMesh->mNormFaces[a];
            for( unsigned int b = 0; b < numIndices; ++b ) {
                face.mIndices.push_back( ReadInt());
            }

            TestForSeparator();
        }
    }

    CheckForClosingBrace();
}